

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3FkRequired(Parse *pParse,Table *pTab,int *aChange,int chngRowid)

{
  int iVar1;
  FKey *pFVar2;
  bool bVar3;
  int local_48;
  FKey *local_40;
  FKey *p;
  int local_30;
  int bHaveFK;
  int eRet;
  int chngRowid_local;
  int *aChange_local;
  Table *pTab_local;
  Parse *pParse_local;
  
  local_30 = 1;
  bVar3 = false;
  if (((pParse->db->flags & 0x4000) != 0) && (pTab->eTabType == '\0')) {
    if (aChange == (int *)0x0) {
      pFVar2 = sqlite3FkReferences(pTab);
      bVar3 = true;
      if (pFVar2 == (FKey *)0x0) {
        bVar3 = (pTab->u).tab.pFKey != (FKey *)0x0;
      }
    }
    else {
      for (local_40 = (pTab->u).tab.pFKey; local_40 != (FKey *)0x0; local_40 = local_40->pNextFrom)
      {
        iVar1 = fkChildIsModified(pTab,local_40,aChange,chngRowid);
        if (iVar1 != 0) {
          iVar1 = sqlite3_stricmp(pTab->zName,local_40->zTo);
          if (iVar1 == 0) {
            local_30 = 2;
          }
          bVar3 = true;
        }
      }
      for (local_40 = sqlite3FkReferences(pTab); local_40 != (FKey *)0x0;
          local_40 = local_40->pNextTo) {
        iVar1 = fkParentIsModified(pTab,local_40,aChange,chngRowid);
        if (iVar1 != 0) {
          if (local_40->aAction[1] != '\0') {
            return 2;
          }
          bVar3 = true;
        }
      }
    }
  }
  if (bVar3) {
    local_48 = local_30;
  }
  else {
    local_48 = 0;
  }
  return local_48;
}

Assistant:

SQLITE_PRIVATE int sqlite3FkRequired(
  Parse *pParse,                  /* Parse context */
  Table *pTab,                    /* Table being modified */
  int *aChange,                   /* Non-NULL for UPDATE operations */
  int chngRowid                   /* True for UPDATE that affects rowid */
){
  int eRet = 1;                   /* Value to return if bHaveFK is true */
  int bHaveFK = 0;                /* If FK processing is required */
  if( pParse->db->flags&SQLITE_ForeignKeys && IsOrdinaryTable(pTab) ){
    if( !aChange ){
      /* A DELETE operation. Foreign key processing is required if the
      ** table in question is either the child or parent table for any
      ** foreign key constraint.  */
      bHaveFK = (sqlite3FkReferences(pTab) || pTab->u.tab.pFKey);
    }else{
      /* This is an UPDATE. Foreign key processing is only required if the
      ** operation modifies one or more child or parent key columns. */
      FKey *p;

      /* Check if any child key columns are being modified. */
      for(p=pTab->u.tab.pFKey; p; p=p->pNextFrom){
        if( fkChildIsModified(pTab, p, aChange, chngRowid) ){
          if( 0==sqlite3_stricmp(pTab->zName, p->zTo) ) eRet = 2;
          bHaveFK = 1;
        }
      }

      /* Check if any parent key columns are being modified. */
      for(p=sqlite3FkReferences(pTab); p; p=p->pNextTo){
        if( fkParentIsModified(pTab, p, aChange, chngRowid) ){
          if( p->aAction[1]!=OE_None ) return 2;
          bHaveFK = 1;
        }
      }
    }
  }
  return bHaveFK ? eRet : 0;
}